

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogText(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  __va_list_tag *in_XMM0_Qb;
  char *in_XMM1_Qa;
  ImGuiTextBuffer *in_XMM1_Qb;
  va_list args;
  ImGuiContext *g;
  undefined1 auStackY_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  __va_list_tag *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  ImGuiTextBuffer *in_stack_ffffffffffffff70;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  ImGuiContext *local_10;
  char *local_8;
  
  local_18 = auStackY_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    in_stack_ffffffffffffff60 = in_XMM0_Qb;
    in_stack_ffffffffffffff68 = in_XMM1_Qa;
    in_stack_ffffffffffffff70 = in_XMM1_Qb;
  }
  local_10 = GImGui;
  if ((GImGui->LogEnabled & 1U) != 0) {
    local_20 = &stack0x00000008;
    local_24 = 0x30;
    local_28 = 8;
    local_d0 = in_RSI;
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    local_8 = in_RDI;
    if (GImGui->LogFile == (FILE *)0x0) {
      ImGuiTextBuffer::appendfv
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    }
    else {
      local_18 = auStackY_d8;
      vfprintf((FILE *)GImGui->LogFile,in_RDI,&local_28);
    }
  }
  return;
}

Assistant:

void ImGui::LogText(const char* fmt, ...)
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    va_list args;
    va_start(args, fmt);
    if (g.LogFile)
        vfprintf(g.LogFile, fmt, args);
    else
        g.LogClipboard.appendfv(fmt, args);
    va_end(args);
}